

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

int __thiscall
Js::FunctionBody::GetStatementIndexFromNativeOffset
          (FunctionBody *this,SmallSpanSequence *pThrowSpanSequence,uint32 nativeOffset)

{
  BOOL BVar1;
  StatementData *pSVar2;
  StatementData local_30;
  StatementData tmpData;
  
  if (pThrowSpanSequence != (SmallSpanSequence *)0x0) {
    tmpData.sourceBegin = -1;
    tmpData.bytecodeBegin = 0;
    local_30.sourceBegin = 0;
    local_30.bytecodeBegin = 0;
    BVar1 = SmallSpanSequence::GetMatchingStatementFromBytecode
                      (pThrowSpanSequence,nativeOffset,(SmallSpanSequenceIter *)&tmpData,&local_30);
    pSVar2 = &local_30;
    if (BVar1 == 0) {
      pSVar2 = (StatementData *)&tmpData.bytecodeBegin;
    }
    return pSVar2->sourceBegin;
  }
  return -1;
}

Assistant:

int FunctionBody::GetStatementIndexFromNativeOffset(SmallSpanSequence *pThrowSpanSequence, uint32 nativeOffset)
    {
        int statementIndex = -1;
        if (pThrowSpanSequence)
        {
            SmallSpanSequenceIter iter;
            StatementData tmpData;
            if (pThrowSpanSequence->GetMatchingStatementFromBytecode(nativeOffset, iter, tmpData))
            {
                statementIndex = tmpData.sourceBegin; // sourceBegin represents statementIndex here
            }
            else
            {
                // If nativeOffset falls on the last span, GetMatchingStatement would miss it because SmallSpanSequence
                // does not know about the last span end. Since we checked that codeAddress is within our range,
                // we can safely consider it matches the last span.
                statementIndex = iter.accumulatedSourceBegin;
            }
        }

        return statementIndex;
    }